

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

string * __thiscall
testing::internal::DeathTestThreadWarning_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,size_t thread_count)

{
  Message *pMVar1;
  Message local_20;
  Message msg;
  size_t thread_count_local;
  
  msg.ss_.ptr_ = (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )this;
  Message::Message(&local_20);
  pMVar1 = Message::operator<<(&local_20,
                               (char (*) [53])"Death tests use fork(), which is unsafe particularly"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [40])" in a threaded context. For this test, ");
  pMVar1 = Message::operator<<(pMVar1,(char (*) [12])"Google Test");
  Message::operator<<(pMVar1,(char (*) [2])0x4df8d0);
  if (msg.ss_.ptr_ == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    Message::operator<<(&local_20,(char (*) [39])"couldn\'t detect the number of threads.");
  }
  else {
    pMVar1 = Message::operator<<(&local_20,(char (*) [10])"detected ");
    pMVar1 = Message::operator<<(pMVar1,(unsigned_long *)&msg);
    Message::operator<<(pMVar1,(char (*) [10])0x4e146f);
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,&local_20);
  Message::~Message(&local_20);
  return __return_storage_ptr__;
}

Assistant:

static std::string DeathTestThreadWarning(size_t thread_count) {
  Message msg;
  msg << "Death tests use fork(), which is unsafe particularly"
      << " in a threaded context. For this test, " << GTEST_NAME_ << " ";
  if (thread_count == 0)
    msg << "couldn't detect the number of threads.";
  else
    msg << "detected " << thread_count << " threads.";
  return msg.GetString();
}